

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O3

void __thiscall R_class::ID_exe(R_class *this,memory *MEM,uint *reg)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = (this->super_order).code[0];
  uVar4 = (this->super_order).code[1];
  this->func7 = iVar3 >> 1;
  uVar2 = (this->super_order).code[2];
  this->func3 = ((int)uVar2 >> 4) % 8;
  uVar5 = uVar4 + 0xf;
  if (-1 < (int)uVar4) {
    uVar5 = uVar4;
  }
  iVar1 = ((int)uVar2 >> 7) + (uVar4 - (uVar5 & 0x7ffffff0)) * 2;
  this->rs_id1 = iVar1;
  iVar3 = (iVar3 - (iVar3 - (iVar3 >> 0x1f) & 0xffffffeU)) * 0x10 + ((int)uVar4 >> 4);
  this->rs_id2 = iVar3;
  this->rs_data1 = reg[iVar1];
  this->rs_data2 = reg[iVar3];
  uVar4 = uVar2 + 0xf;
  if (-1 < (int)uVar2) {
    uVar4 = uVar2;
  }
  this->rd_id = ((this->super_order).code[3] >> 7) + (uVar2 - (uVar4 & 0x7ffffff0)) * 2;
  return;
}

Assistant:

void R_class::ID_exe(memory &MEM,unsigned int *reg) {
    func7=code[0]>>1;
    func3=(code[2]>>4)%8;
    rs_id1=((code[1]%16)<<1)+(code[2]>>7);
    rs_id2=(code[1]>>4)+((code[0]%2)<<4);
    rs_data1=reg[rs_id1];
    rs_data2=reg[rs_id2];
    rd_id=((code[2]%16)<<1)+(code[3]>>7);
}